

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnlabeledValueArg.h
# Opt level: O1

bool __thiscall
TCLAP::
UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::processArg(UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,int *i,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args)

{
  string *val;
  pointer pbVar1;
  ulong uVar2;
  pointer pcVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if ((this->
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_Arg._alreadySet != false) {
    return false;
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  val = pbVar1 + *i;
  uVar2 = pbVar1[*i]._M_string_length;
  bVar6 = 1 < uVar2;
  if (bVar6) {
    pcVar3 = (val->_M_dataplus)._M_p;
    if (pcVar3[1] == '\a') {
      return false;
    }
    uVar4 = 2;
    do {
      uVar5 = uVar4;
      if (uVar2 == uVar5) break;
      uVar4 = uVar5 + 1;
    } while (pcVar3[uVar5] != '\a');
    bVar6 = uVar5 < uVar2;
  }
  if (bVar6) {
    return false;
  }
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  _extractValue(&this->
                 super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,val);
  (this->
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_Arg._alreadySet = true;
  return true;
}

Assistant:

bool UnlabeledValueArg<T>::processArg(int *i, std::vector<std::string>& args) 
{
	
	if ( _alreadySet )
		return false;
	
	if ( _hasBlanks( args[*i] ) )
		return false;

	// never ignore an unlabeled arg
	
	_extractValue( args[*i] );
	_alreadySet = true;
	return true;
}